

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>::operator%=
          (uintwide_t<8192U,_unsigned_int,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  long lVar1;
  uintwide_t<24U,_unsigned_char,_void,_false> remainder;
  uintwide_t<24U,_unsigned_char,_void,_false> auStack_418 [341];
  
  if (this == (uintwide_t<8192U,_unsigned_int,_void,_false> *)other) {
    for (lVar1 = 0; lVar1 != 0x400; lVar1 = lVar1 + 4) {
      *(undefined4 *)(this + lVar1) = 0;
    }
  }
  else {
    memset(auStack_418,0,0x400);
    uintwide_t((uintwide_t<8192U,_unsigned_int,_void,_false> *)auStack_418);
    eval_divide_knuth(this,other,auStack_418);
    memcpy(this,auStack_418,0x400);
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator%=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary modulus function.
        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          local_unsigned_wide_type remainder_unsigned { };

          a.eval_divide_knuth(b, &remainder_unsigned);

          // The sign of the remainder follows the sign of the denominator.
          if(numer_was_neg) { remainder_unsigned.negate(); }

          values = remainder_unsigned.values;
        }
        else
        {
          uintwide_t remainder { };

          eval_divide_knuth(other, &remainder);

          values = remainder.values;
        }
      }

      return *this;
    }